

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

void wallscan(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat,
             _func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  float fVar1;
  BYTE *pBVar2;
  fixed_t fVar3;
  int fracbits_00;
  DWORD DVar4;
  fixed_t fVar5;
  int iVar6;
  int iVar7;
  int b;
  BYTE *pBVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  BYTE *i;
  bool fixed;
  double iscale;
  BYTE *basecolormapdata;
  SDWORD xoffset;
  float light;
  char bad;
  int z;
  int d4;
  int u4;
  int y2ve [4];
  int y1ve [4];
  uint local_3c;
  int fracbits;
  int x;
  double yrepeat_local;
  fixed_t *lwal_local;
  float *swal_local;
  short *dwal_local;
  short *uwal_local;
  int x2_local;
  int x1_local;
  
  basecolormapdata._4_4_ = rw_light - rw_lightstep;
  if (rw_pic->UseType != '\r') {
    FTexture::GetHeight(rw_pic);
    fracbits_00 = 0x20 - (uint)rw_pic->HeightBits;
    setupvline(fracbits_00);
    fVar3 = rw_offset;
    pBVar2 = basecolormap->Maps;
    bVar9 = fixedcolormap != (lighttable_t *)0x0;
    bVar10 = -1 < fixedlightlev;
    local_3c = x1;
    if (bVar9 || bVar10) {
      palookupoffse[0] = dc_colormap;
      palookupoffse[1] = dc_colormap;
      palookupoffse[2] = dc_colormap;
      palookupoffse[3] = dc_colormap;
    }
    for (; iVar6 = wallshade, (int)local_3c < x2 && (local_3c & 3) != 0; local_3c = local_3c + 1) {
      basecolormapdata._4_4_ = rw_lightstep + basecolormapdata._4_4_;
      y2ve[2] = (int)uwal[(int)local_3c];
      d4 = (int)dwal[(int)local_3c];
      if (y2ve[2] < d4) {
        if (viewheight <= y2ve[2]) {
          __assert_fail("y1ve[0] < viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x468,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (viewheight < d4) {
          __assert_fail("y2ve[0] <= viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x469,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (!bVar9 && !bVar10) {
          dVar11 = MIN<double>(24.0,(double)basecolormapdata._4_4_);
          fVar5 = FloatToFixed(dVar11);
          iVar6 = clamp<int>(iVar6 - fVar5 >> 0x10,0,0x1f);
          dc_colormap = pBVar2 + (iVar6 << 8);
        }
        dc_source = (*getcol)(rw_pic,lwal[(int)local_3c] + fVar3 >> 0x10);
        dc_dest = dc_destorg + (int)(ylookup[y2ve[2]] + local_3c);
        dc_count = d4 - y2ve[2];
        fVar1 = swal[(int)local_3c];
        dc_iscale = xs_ToFixed(fracbits_00,(real64)((double)fVar1 * yrepeat));
        dc_texturefrac =
             xs_ToFixed(fracbits_00,
                        (real64)(dc_texturemid +
                                (double)fVar1 * yrepeat * (((double)y2ve[2] - CenterY) + 0.5)));
        (*dovline1)();
      }
    }
    for (; (int)local_3c < x2 + -3; local_3c = local_3c + 4) {
      xoffset._3_1_ = 0;
      for (light = 4.2039e-45; -1 < (int)light; light = (float)((int)light + -1)) {
        y2ve[(long)(int)light + 2] = (int)uwal[(int)(local_3c + (int)light)];
        (&d4)[(int)light] = (int)dwal[(int)(local_3c + (int)light)];
        if (y2ve[(long)(int)light + 2] < (&d4)[(int)light]) {
          if (viewheight <= y2ve[(long)(int)light + 2]) {
            __assert_fail("y1ve[z] < viewheight",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                          ,0x482,
                          "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                         );
          }
          if (viewheight < (&d4)[(int)light]) {
            __assert_fail("y2ve[z] <= viewheight",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                          ,0x483,
                          "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                         );
          }
          pBVar8 = (*getcol)(rw_pic,lwal[(int)(local_3c + (int)light)] + fVar3 >> 0x10);
          bufplce[(int)light] = pBVar8;
          fVar1 = swal[(int)(local_3c + (int)light)];
          DVar4 = xs_ToFixed(fracbits_00,(real64)((double)fVar1 * yrepeat));
          vince[(int)light] = DVar4;
          DVar4 = xs_ToFixed(fracbits_00,
                             (real64)(dc_texturemid +
                                     (double)fVar1 * yrepeat *
                                     (((double)y2ve[(long)(int)light + 2] - CenterY) + 0.5)));
          vplce[(int)light] = DVar4;
        }
        else {
          xoffset._3_1_ = xoffset._3_1_ + (char)(1 << (SUB41(light,0) & 0x1f));
        }
      }
      if (xoffset._3_1_ == 0xf) {
        basecolormapdata._4_4_ = rw_lightstep * 4.0 + basecolormapdata._4_4_;
      }
      else {
        if (!bVar9 && !bVar10) {
          for (light = 0.0; iVar6 = wallshade, (int)light < 4; light = (float)((int)light + 1)) {
            basecolormapdata._4_4_ = rw_lightstep + basecolormapdata._4_4_;
            dVar11 = MIN<double>(24.0,(double)basecolormapdata._4_4_);
            fVar5 = FloatToFixed(dVar11);
            iVar6 = clamp<int>(iVar6 - fVar5 >> 0x10,0,0x1f);
            palookupoffse[(int)light] = pBVar2 + (iVar6 << 8);
          }
        }
        iVar6 = MAX<int>(y2ve[2],y2ve[3]);
        iVar7 = MAX<int>(y1ve[0],y1ve[1]);
        iVar6 = MAX<int>(iVar6,iVar7);
        iVar7 = MIN<int>(d4,u4);
        b = MIN<int>(y2ve[0],y2ve[1]);
        iVar7 = MIN<int>(iVar7,b);
        if ((xoffset._3_1_ == 0) && (iVar6 < iVar7)) {
          for (light = 0.0; (int)light < 4; light = (float)((int)light + 1)) {
            if (y2ve[(long)(int)light + 2] < iVar6) {
              DVar4 = prevline1(vince[(int)light],palookupoffse[(int)light],
                                iVar6 - y2ve[(long)(int)light + 2],vplce[(int)light],
                                bufplce[(int)light],
                                dc_destorg +
                                (int)(ylookup[y2ve[(long)(int)light + 2]] + local_3c + (int)light));
              vplce[(int)light] = DVar4;
            }
          }
          if (iVar6 < iVar7) {
            dc_count = iVar7 - iVar6;
            dc_dest = dc_destorg + (int)(ylookup[iVar6] + local_3c);
            vlinetallasm4();
          }
          pBVar8 = dc_destorg;
          iVar6 = ylookup[iVar7];
          for (light = 0.0; (int)light < 4; light = (float)((int)light + 1)) {
            if (iVar7 < (&d4)[(int)light]) {
              prevline1(vince[(int)light],palookupoffse[0],(&d4)[(int)light] - iVar7,
                        vplce[(int)light],bufplce[(int)light],
                        pBVar8 + (long)(int)light + (long)(int)(local_3c + iVar6));
            }
          }
        }
        else {
          for (light = 0.0; (int)light < 4; light = (float)((int)light + 1)) {
            if ((xoffset._3_1_ & 1) == 0) {
              prevline1(vince[(int)light],palookupoffse[(int)light],
                        (&d4)[(int)light] - y2ve[(long)(int)light + 2],vplce[(int)light],
                        bufplce[(int)light],
                        dc_destorg +
                        (int)(ylookup[y2ve[(long)(int)light + 2]] + local_3c + (int)light));
            }
            xoffset._3_1_ = (char)xoffset._3_1_ >> 1;
          }
        }
      }
    }
    for (; iVar6 = wallshade, (int)local_3c < x2; local_3c = local_3c + 1) {
      basecolormapdata._4_4_ = rw_lightstep + basecolormapdata._4_4_;
      y2ve[2] = (int)uwal[(int)local_3c];
      d4 = (int)dwal[(int)local_3c];
      if (y2ve[2] < d4) {
        if (viewheight <= y2ve[2]) {
          __assert_fail("y1ve[0] < viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x4c7,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (viewheight < d4) {
          __assert_fail("y2ve[0] <= viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x4c8,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (!bVar9 && !bVar10) {
          dVar11 = MIN<double>(24.0,(double)basecolormapdata._4_4_);
          fVar5 = FloatToFixed(dVar11);
          iVar6 = clamp<int>(iVar6 - fVar5 >> 0x10,0,0x1f);
          dc_colormap = pBVar2 + (iVar6 << 8);
        }
        dc_source = (*getcol)(rw_pic,lwal[(int)local_3c] + fVar3 >> 0x10);
        dc_dest = dc_destorg + (int)(ylookup[y2ve[2]] + local_3c);
        dc_count = d4 - y2ve[2];
        fVar1 = swal[(int)local_3c];
        dc_iscale = xs_ToFixed(fracbits_00,(real64)((double)fVar1 * yrepeat));
        dc_texturefrac =
             xs_ToFixed(fracbits_00,
                        (real64)(dc_texturemid +
                                (double)fVar1 * yrepeat * (((double)y2ve[2] - CenterY) + 0.5)));
        (*dovline1)();
      }
    }
    NetUpdate();
  }
  return;
}

Assistant:

void wallscan (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal,
			   double yrepeat, const BYTE *(*getcol)(FTexture *tex, int x))
{
	int x, fracbits;
	int y1ve[4], y2ve[4], u4, d4, z;
	char bad;
	float light = rw_light - rw_lightstep;
	SDWORD xoffset;
	BYTE *basecolormapdata;
	double iscale;

	// This function also gets used to draw skies. Unlike BUILD, skies are
	// drawn by visplane instead of by bunch, so these checks are invalid.
	//if ((uwal[x1] > viewheight) && (uwal[x2] > viewheight)) return;
	//if ((dwal[x1] < 0) && (dwal[x2] < 0)) return;

	if (rw_pic->UseType == FTexture::TEX_Null)
	{
		return;
	}

//extern cycle_t WallScanCycles;
//clock (WallScanCycles);

	rw_pic->GetHeight();	// Make sure texture size is loaded
	fracbits = 32 - rw_pic->HeightBits;
	setupvline(fracbits);
	xoffset = rw_offset;
	basecolormapdata = basecolormap->Maps;

	x = x1;
	//while ((umost[x] > dmost[x]) && (x < x2)) x++;

	bool fixed = (fixedcolormap != NULL || fixedlightlev >= 0);
	if (fixed)
	{
		palookupoffse[0] = dc_colormap;
		palookupoffse[1] = dc_colormap;
		palookupoffse[2] = dc_colormap;
		palookupoffse[3] = dc_colormap;
	}

	for(; (x < x2) && (x & 3); ++x)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;
		assert (y1ve[0] < viewheight);
		assert (y2ve[0] <= viewheight);

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + x + dc_destorg;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		dovline1();
	}

	for(; x < x2-3; x += 4)
	{
		bad = 0;
		for (z = 3; z>= 0; --z)
		{
			y1ve[z] = uwal[x+z];//max(uwal[x+z],umost[x+z]);
			y2ve[z] = dwal[x+z];//min(dwal[x+z],dmost[x+z])-1;
			if (y2ve[z] <= y1ve[z]) { bad += 1<<z; continue; }
			assert (y1ve[z] < viewheight);
			assert (y2ve[z] <= viewheight);

			bufplce[z] = getcol (rw_pic, (lwal[x+z] + xoffset) >> FRACBITS);
			iscale = swal[x + z] * yrepeat;
			vince[z] = xs_ToFixed(fracbits, iscale);
			vplce[z] = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[z] - CenterY + 0.5));
		}
		if (bad == 15)
		{
			light += rw_lightstep * 4;
			continue;
		}

		if (!fixed)
		{
			for (z = 0; z < 4; ++z)
			{
				light += rw_lightstep;
				palookupoffse[z] = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
			}
		}

		u4 = MAX(MAX(y1ve[0],y1ve[1]),MAX(y1ve[2],y1ve[3]));
		d4 = MIN(MIN(y2ve[0],y2ve[1]),MIN(y2ve[2],y2ve[3]));

		if ((bad != 0) || (u4 >= d4))
		{
			for (z = 0; z < 4; ++z)
			{
				if (!(bad & 1))
				{
					prevline1(vince[z],palookupoffse[z],y2ve[z]-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+x+z+dc_destorg);
				}
				bad >>= 1;
			}
			continue;
		}

		for (z = 0; z < 4; ++z)
		{
			if (u4 > y1ve[z])
			{
				vplce[z] = prevline1(vince[z],palookupoffse[z],u4-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+x+z+dc_destorg);
			}
		}

		if (d4 > u4)
		{
			dc_count = d4-u4;
			dc_dest = ylookup[u4]+x+dc_destorg;
			dovline4();
		}

		BYTE *i = x+ylookup[d4]+dc_destorg;
		for (z = 0; z < 4; ++z)
		{
			if (y2ve[z] > d4)
			{
				prevline1(vince[z],palookupoffse[0],y2ve[z]-d4,vplce[z],bufplce[z],i+z);
			}
		}
	}
	for(;x<x2;x++)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;
		assert (y1ve[0] < viewheight);
		assert (y2ve[0] <= viewheight);

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + x + dc_destorg;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		dovline1();
	}

//unclock (WallScanCycles);

	NetUpdate ();
}